

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expertInline.hpp
# Opt level: O2

void __thiscall FastLinearExpert<1,_1>::m_step(FastLinearExpert<1,_1> *this)

{
  XZ *pXVar1;
  ActualDstType actualDst_2;
  ActualDstType actualDst;
  ActualDstType actualDst_1;
  double adVar2 [1];
  double dVar3;
  Scal SVar4;
  double adVar5 [1];
  double dVar6;
  double dVar7;
  X meanX;
  Z meanZ;
  Z SZ;
  X *local_b0;
  plain_array<double,_1,_0,_0> local_a8;
  plain_array<double,_1,_0,_0> local_a0;
  DenseStorage<double,_1,_1,_1,_0> local_98;
  DenseStorage<double,_1,_1,_1,_0> local_90;
  undefined1 local_88 [32];
  scalar_constant_op<double> local_68;
  RhsNested local_60;
  RhsNested local_58;
  scalar_constant_op<double> local_40;
  
  dVar6 = (this->super_LinearExpert<1,_1>).Sh;
  local_68.m_other = (this->super_LinearExpert<1,_1>).wNu;
  dVar3 = (this->super_LinearExpert<1,_1>).wSigma;
  dVar7 = dVar6 + local_68.m_other;
  adVar2[0] = (this->super_LinearExpert<1,_1>).Sz.
              super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.m_data.array[0]
              / dVar6;
  adVar5[0] = (this->super_LinearExpert<1,_1>).Sx.
              super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.m_data.array[0]
              / dVar6;
  local_a8.array[0] = (double  [1])(double  [1])adVar5[0];
  local_a0.array[0] = (double  [1])(double  [1])adVar2[0];
  if ((local_68.m_other != 0.0) || (NAN(local_68.m_other))) {
    local_88._8_8_ = &(this->super_LinearExpert<1,_1>).Sz;
    local_60.m_matrix = &(this->super_LinearExpert<1,_1>).Nu0;
    local_40.m_other = dVar7;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,1,1,0,1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,1,1,0,1,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,1,0,1,1>const>const,Eigen::Matrix<double,1,1,0,1,1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,1,0,1,1>const>const>>
              ((Matrix<double,_1,_1,_0,_1,_1> *)this,
               (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                *)local_88);
    adVar2[0] = (this->super_LinearExpert<1,_1>).Nu.
                super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.m_data.array
                [0];
  }
  else {
    (this->super_LinearExpert<1,_1>).Nu.super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>
    .m_storage.m_data.array[0] = adVar2[0];
  }
  dVar6 = dVar6 + dVar3;
  local_88._8_8_ = &this->invSzz0;
  local_98.m_data.array[0] =
       (plain_array<double,_1,_0,_0>)
       ((this->invSzz0).super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.
        m_data.array[0] * adVar2[0]);
  dVar3 = -1.0 / dVar7 + (double)local_98.m_data.array[0] * adVar2[0];
  local_88._16_8_ = &local_98;
  local_68.m_other = dVar3;
  local_58.m_matrix = (non_const_type)&local_98;
  local_40.m_other = dVar6;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,1,1,0,1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,1,1,0,1,1>const,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,1,1,0,1,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,1,0,1,1>const>const>,Eigen::Transpose<Eigen::Matrix<double,1,1,0,1,1>>,0>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,1,0,1,1>const>const>>
            (&(this->super_LinearExpert<1,_1>).invSigma,
             (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>,_Eigen::Transpose<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>,_0>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
              *)local_88);
  dVar6 = ((dVar6 / dVar7) / dVar3) * -this->detInvSzz0;
  if (dVar6 < 0.0) {
    SVar4 = sqrt(dVar6);
  }
  else {
    SVar4 = SQRT(dVar6);
  }
  (this->super_LinearExpert<1,_1>).sqrtDetInvSigma = SVar4;
  local_88._0_8_ = &this->invSzz;
  dVar6 = (this->super_LinearExpert<1,_1>).Sz.
          super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.m_data.array[0];
  local_98.m_data.array[0] =
       (plain_array<double,_1,_0,_0>)
       ((this->invSzz).super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.m_data
        .array[0] * dVar6);
  local_88._24_8_ = (double)local_98.m_data.array[0] * dVar6 - (this->super_LinearExpert<1,_1>).Sh;
  local_88._8_8_ = &local_98;
  local_60.m_matrix = (non_const_type)&local_98;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,1,1,0,1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,1,1,0,1,1>const,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,1,1,0,1,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,1,0,1,1>const>const>,Eigen::Transpose<Eigen::Matrix<double,1,1,0,1,1>>,0>const>>
            (&(this->super_LinearExpert<1,_1>).varLambda,
             (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>,_Eigen::Transpose<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>,_0>_>
              *)local_88);
  local_90.m_data.array[0] =
       (plain_array<double,_1,_0,_0>)
       ((this->super_LinearExpert<1,_1>).Sxz.
        super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.m_data.array[0] -
       (this->super_LinearExpert<1,_1>).Sz.
       super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.m_data.array[0] *
       adVar5[0]);
  pXVar1 = &(this->super_LinearExpert<1,_1>).Lambda;
  (this->super_LinearExpert<1,_1>).Lambda.
  super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.m_data.array[0] =
       (double)local_90.m_data.array[0] *
       (this->super_LinearExpert<1,_1>).varLambda.
       super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.m_data.array[0];
  local_b0 = &(this->super_LinearExpert<1,_1>).Mu;
  (this->super_LinearExpert<1,_1>).Mu.super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.
  m_storage.m_data.array[0] = adVar5[0];
  local_88._16_8_ = &local_a0;
  local_88._0_8_ = pXVar1;
  local_88._8_8_ = this;
  Eigen::NoAlias<Eigen::Matrix<double,1,1,0,1,1>,Eigen::MatrixBase>::operator+=
            ((NoAlias<Eigen::Matrix<double,1,1,0,1,1>,Eigen::MatrixBase> *)&local_b0,
             (MatrixBase<Eigen::Product<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>,_0>_>
              *)local_88);
  local_b0 = &(this->super_LinearExpert<1,_1>).Psi;
  (this->super_LinearExpert<1,_1>).Psi.super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.
  m_storage.m_data.array[0] =
       (this->super_LinearExpert<1,_1>).Sxx.
       super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.m_data.array[0];
  local_88._8_8_ = &local_a8;
  local_88._16_8_ = &(this->super_LinearExpert<1,_1>).Sx;
  local_60.m_matrix = (non_const_type)&local_90;
  local_58.m_matrix = pXVar1;
  Eigen::NoAlias<Eigen::Matrix<double,1,1,0,1,1>,Eigen::MatrixBase>::operator-=
            ((NoAlias<Eigen::Matrix<double,1,1,0,1,1>,Eigen::MatrixBase> *)&local_b0,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>,_const_Eigen::PartialReduxExpr<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>,_Eigen::internal::member_sum<double,_double>,_1>_>_>
              *)local_88);
  dVar6 = (this->super_LinearExpert<1,_1>).Psi.
          super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.m_data.array[0] /
          ((this->super_LinearExpert<1,_1>).wPsi + (this->super_LinearExpert<1,_1>).Sh + 2.0);
  (this->super_LinearExpert<1,_1>).Psi.super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.
  m_storage.m_data.array[0] = dVar6;
  dVar6 = 1.0 / dVar6;
  (this->super_LinearExpert<1,_1>).invPsi.
  super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.m_data.array[0] = dVar6;
  if (dVar6 < 0.0) {
    SVar4 = sqrt(dVar6);
  }
  else {
    SVar4 = SQRT(dVar6);
  }
  (this->super_LinearExpert<1,_1>).sqrtDetInvPsi = SVar4;
  (this->super_LinearExpert<1,_1>).recompute = true;
  return;
}

Assistant:

EXPERT_CLASS_TEMPLATE
void FAST_LINEAR_EXPERT_base::m_step()
{
	Z SZ;
	Scal DEN;
	Scal ShSigma = Sh + wSigma, ShNu = Sh + wNu;
    Z meanZ = Sz / Sh;
    X meanX = Sx / Sh;

    if( wNu == 0.0 )
        Nu = meanZ;
    else
        Nu = (Sz + wNu*Nu0) / ShNu;

	// Using Moore-Penrose Rank-1 downdate
	SZ = invSzz0 * Nu;
	DEN = Nu.dot(SZ) - 1.0/ShNu;
	invSigma = (invSzz0 - (SZ/DEN) * SZ.transpose()) * ShSigma;
	// Using Determinant Rank-1 downdate
	sqrtDetInvSigma = sqrt( -detInvSzz0 * ( pow(ShSigma,d) / ShNu / DEN) );


	// Using Moore-Penrose Rank-1 update
	SZ = invSzz * Sz;
	DEN = Sz.dot(SZ) - Sh;
	varLambda = invSzz - (SZ/DEN) * SZ.transpose();

    XZ xz = Sxz;
    xz.noalias() -= meanX*Sz.transpose();
    Lambda.noalias() = xz * varLambda;
    Mu = meanX;
    Mu.noalias() += Lambda * (Nu - meanZ);

    Psi = Sxx;
//Psi += wPsi * mixture->getPsi();
    Psi.noalias() -= meanX.cwiseProduct(Sx) + xz.cwiseProduct(Lambda).rowwise().sum();
    Psi /= (wPsi + Sh + 2.0 );
    invPsi = Psi.cwiseInverse();
    sqrtDetInvPsi = sqrt(invPsi.prod());

    recompute = true;
}